

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

int cmListFileLexerInput(cmListFileLexer *lexer,char *buffer,size_t bufferSize)

{
  size_t sVar1;
  int local_54;
  int length;
  char *e;
  char *i;
  char *o;
  size_t n;
  size_t cr;
  size_t bufferSize_local;
  char *buffer_local;
  cmListFileLexer *lexer_local;
  
  if (lexer != (cmListFileLexer *)0x0) {
    if (lexer->file != (FILE *)0x0) {
      o = (char *)lexer->cr;
      *buffer = '\r';
      sVar1 = fread(buffer + (long)o,1,bufferSize - (long)o,(FILE *)lexer->file);
      if (sVar1 == 0) {
        n = 0;
      }
      else {
        n = (size_t)(int)(uint)(buffer[(long)(o + sVar1 + -1)] == '\r');
        e = buffer;
        i = buffer;
        while (e != buffer + (long)(o + sVar1) + -n) {
          if ((*e == '\r') && (e[1] == '\n')) {
            e = e + 1;
          }
          *i = *e;
          e = e + 1;
          i = i + 1;
        }
        o = i + -(long)buffer;
      }
      lexer->cr = n;
      return (int)o;
    }
    if (lexer->string_left != 0) {
      local_54 = lexer->string_left;
      if ((int)bufferSize < lexer->string_left) {
        local_54 = (int)bufferSize;
      }
      memcpy(buffer,lexer->string_position,(long)local_54);
      lexer->string_position = lexer->string_position + local_54;
      lexer->string_left = lexer->string_left - local_54;
      return local_54;
    }
  }
  return 0;
}

Assistant:

static int cmListFileLexerInput(cmListFileLexer* lexer, char* buffer,
                                size_t bufferSize)
{
  if (lexer) {
    if (lexer->file) {
      /* Convert CRLF -> LF explicitly.  The C FILE "t"ext mode
         does not convert newlines on all platforms.  Move any
         trailing CR to the start of the buffer for the next read. */
      size_t cr = lexer->cr;
      size_t n;
      buffer[0] = '\r';
      n = fread(buffer + cr, 1, bufferSize - cr, lexer->file);
      if (n) {
        char* o = buffer;
        const char* i = buffer;
        const char* e;
        n += cr;
        cr = (buffer[n - 1] == '\r') ? 1 : 0;
        e = buffer + n - cr;
        while (i != e) {
          if (i[0] == '\r' && i[1] == '\n') {
            ++i;
          }
          *o++ = *i++;
        }
        n = o - buffer;
      } else {
        n = cr;
        cr = 0;
      }
      lexer->cr = cr;
      return n;
    } else if (lexer->string_left) {
      int length = lexer->string_left;
      if ((int)bufferSize < length) {
        length = (int)bufferSize;
      }
      memcpy(buffer, lexer->string_position, length);
      lexer->string_position += length;
      lexer->string_left -= length;
      return length;
    }
  }
  return 0;
}